

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

void cs_free(cs_insn *insn,size_t count)

{
  cs_detail **ppcVar1;
  
  if (count != 0) {
    ppcVar1 = &insn->detail;
    do {
      (*cs_mem_free)(*ppcVar1);
      ppcVar1 = ppcVar1 + 0x1e;
      count = count - 1;
    } while (count != 0);
  }
  (*cs_mem_free)(insn);
  return;
}

Assistant:

CAPSTONE_API cs_free(cs_insn *insn, size_t count)
{
	size_t i;

	// free all detail pointers
	for (i = 0; i < count; i++)
		cs_mem_free(insn[i].detail);

	// then free pointer to cs_insn array
	cs_mem_free(insn);
}